

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O2

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::convertImageType(toktxApp *this,unique_ptr<Image,_std::default_delete<Image>_> *pImage)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  long *in_RDX;
  _func_int **local_50;
  undefined4 local_48;
  uint local_44;
  string nullSwizzle;
  
  iVar3 = *(int *)&pImage[100]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
                   super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
                   super__Head_base<0UL,_Image_*,_false>._M_head_impl;
  iVar2 = (**(code **)(*(long *)*in_RDX + 0x28))();
  if (iVar3 == iVar2) {
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)*in_RDX;
    *in_RDX = 0;
  }
  else {
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nullSwizzle,"rgba",(allocator<char> *)&local_50);
    iVar3 = (**(code **)(*(long *)*in_RDX + 0x30))();
    uVar1 = *(undefined4 *)
             &pImage[100]._M_t.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
              super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
              super__Head_base<0UL,_Image_*,_false>._M_head_impl;
    if (iVar3 == 2) {
      switch(uVar1) {
      case 0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x487,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
      case 1:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_short,1u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 0xb0))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      case 2:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_short,2u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 0xb8))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      case 3:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_short,3u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 0xc0))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      case 4:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_short,4u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 200))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      default:
        goto switchD_00110541_default;
      }
    }
    else {
      switch(uVar1) {
      case 0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x49c,"unique_ptr<Image> toktxApp::convertImageType(unique_ptr<Image>)");
      case 1:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_char,1u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 0xb0))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      case 2:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_char,2u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 0xb8))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      case 3:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_char,3u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 0xc0))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      case 4:
        local_44 = *(uint *)(*in_RDX + 8);
        local_48 = *(undefined4 *)(*in_RDX + 0xc);
        std::make_unique<ImageT<unsigned_char,4u>,unsigned_int,unsigned_int>
                  ((uint *)&local_50,&local_44);
        (this->super_scApp).super_ktxApp._vptr_ktxApp = local_50;
        (**(code **)(*(long *)*in_RDX + 200))
                  ((long *)*in_RDX,local_50,nullSwizzle._M_string_length,
                   nullSwizzle._M_dataplus._M_p);
        break;
      default:
        goto switchD_00110541_default;
      }
    }
    if (local_50 == (_func_int **)0x0) {
switchD_00110541_default:
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Out of memory for image with new target type.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::~string((string *)&nullSwizzle);
  }
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

unique_ptr<Image>
toktxApp::convertImageType(unique_ptr<Image> pImage)
{
    // TODO: These copyTo's should be reversed. The image should have
    // a copy constructor for each componentCount src image.
    if (options.targetType != (int)pImage->getComponentCount()) {
        unique_ptr<Image> newImage;
        string nullSwizzle = "rgba";
        // The casts in the following copyTo* definitions only work
        // because, thanks to the switch, at runtime we always pass
        // the image type being cast to.
        if (pImage->getComponentSize() == 2) {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba16image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        } else {
            switch (options.targetType) {
              case commandOptions::eR:
                newImage = make_unique<r8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToR(*newImage, nullSwizzle);
                break;
              case commandOptions::eRG:
                newImage = make_unique<rg8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRG(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGB:
                newImage = make_unique<rgb8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGB(*newImage, nullSwizzle);
                break;
              case commandOptions::eRGBA:
                newImage = make_unique<rgba8image>(pImage->getWidth(), pImage->getHeight());
                pImage->copyToRGBA(*newImage, nullSwizzle);
                break;
              case commandOptions::eUnspecified:
                assert(false);
            }
        }
        if (newImage) {
             return newImage;
        } else {
            throw runtime_error(
                "Out of memory for image with new target type."
            );
        }
    }
    return pImage;
}